

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O2

bool dxil_spv::emit_interpolate_instruction(GLSLstd450 opcode,Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  uint uVar3;
  Id IVar4;
  Builder *this;
  mapped_type *pmVar5;
  Operation *pOVar6;
  Value *pVVar7;
  Constant *this_00;
  APInt *this_01;
  int64_t iVar8;
  Builder *this_02;
  bool bVar9;
  Id resultId;
  uint i;
  long lVar10;
  Id offsets [2];
  uint32_t input_element_index;
  Id local_58;
  Id local_54;
  mapped_type *local_50;
  CallInst *local_48;
  initializer_list<unsigned_int> local_40;
  
  this = Converter::Impl::builder(impl);
  bVar1 = get_constant_operand(&instruction->super_Instruction,1,&input_element_index);
  if (bVar1) {
    pmVar5 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->input_elements_meta,&input_element_index);
    resultId = pmVar5->id;
    IVar2 = spv::Builder::getDerefTypeId(this,resultId);
    uVar3 = spv::Builder::getNumTypeConstituents(this,IVar2);
    local_50 = pmVar5;
    if (1 < uVar3) {
      IVar2 = Converter::Impl::get_effective_input_output_type_id(impl,pmVar5->component_type);
      IVar2 = spv::Builder::makePointer(this,StorageClassInput,IVar2);
      pOVar6 = Converter::Impl::allocate(impl,OpAccessChain,IVar2);
      local_58 = resultId;
      pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
      local_54 = Converter::Impl::get_id_for_value(impl,pVVar7,0x20);
      local_40._M_len = 2;
      local_40._M_array = &local_58;
      Operation::add_ids(pOVar6,&local_40);
      Converter::Impl::add(impl,pOVar6,false);
      resultId = pOVar6->id;
    }
    if (impl->glsl_std450_ext == 0) {
      IVar2 = spv::Builder::import(this,"GLSL.std.450");
      impl->glsl_std450_ext = IVar2;
    }
    if (opcode == GLSLstd450InterpolateAtSample) {
      pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
      IVar2 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
    }
    else {
      IVar2 = 0;
      if (opcode == GLSLstd450InterpolateAtOffset) {
        offsets[0] = 0;
        offsets[1] = 0;
        bVar9 = false;
        local_48 = instruction;
        for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
          uVar3 = (uint)lVar10 | 4;
          pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar3);
          this_00 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(pVVar7)->super_Constant;
          if (this_00 == (Constant *)0x0) {
            pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar3);
            IVar2 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
            this_02 = Converter::Impl::builder(impl);
            IVar4 = spv::Builder::makeUintType(this_02,0x20);
            pOVar6 = Converter::Impl::allocate(impl,OpBitFieldSExtract,IVar4);
            Operation::add_id(pOVar6,IVar2);
            IVar2 = spv::Builder::makeUintConstant(this_02,0,false);
            Operation::add_id(pOVar6,IVar2);
            IVar2 = spv::Builder::makeUintConstant(this_02,4,false);
            Operation::add_id(pOVar6,IVar2);
            IVar2 = pOVar6->id;
            Converter::Impl::add(impl,pOVar6,false);
            IVar4 = spv::Builder::makeFloatType(this_02,0x20);
            pOVar6 = Converter::Impl::allocate(impl,OpConvertSToF,IVar4);
            Operation::add_id(pOVar6,IVar2);
            IVar2 = pOVar6->id;
            Converter::Impl::add(impl,pOVar6,false);
            IVar4 = spv::Builder::makeFloatType(this_02,0x20);
            pOVar6 = Converter::Impl::allocate(impl,OpFMul,IVar4);
            local_58 = IVar2;
            local_54 = spv::Builder::makeFloatConstant(this_02,0.0625,false);
            local_40._M_array = &local_58;
            local_40._M_len = 2;
            Operation::add_ids(pOVar6,&local_40);
            IVar2 = pOVar6->id;
            Converter::Impl::add(impl,pOVar6,false);
            offsets[lVar10] = IVar2;
            bVar9 = true;
            instruction = local_48;
          }
          else {
            this_01 = LLVMBC::Constant::getUniqueInteger(this_00);
            iVar8 = LLVMBC::APInt::getSExtValue(this_01);
            IVar2 = spv::Builder::makeFloatConstant(this,(float)iVar8 * 0.0625,false);
            offsets[lVar10] = IVar2;
          }
        }
        IVar2 = spv::Builder::makeFloatType(this,0x20);
        if (bVar9) {
          IVar2 = Converter::Impl::build_vector(impl,IVar2,offsets,2);
        }
        else {
          IVar2 = Converter::Impl::build_constant_vector(impl,IVar2,offsets,2);
        }
      }
    }
    IVar4 = Converter::Impl::get_effective_input_output_type_id(impl,local_50->component_type);
    pOVar6 = Converter::Impl::allocate(impl,OpExtInst,(Value *)instruction,IVar4);
    Operation::add_id(pOVar6,impl->glsl_std450_ext);
    Operation::add_literal(pOVar6,opcode);
    Operation::add_id(pOVar6,resultId);
    if (IVar2 != 0) {
      Operation::add_id(pOVar6,IVar2);
    }
    Converter::Impl::add(impl,pOVar6,false);
    Converter::Impl::fixup_load_type_io(impl,local_50->component_type,1,(Value *)instruction);
    spv::Builder::addCapability(this,CapabilityInterpolationFunction);
  }
  return bVar1;
}

Assistant:

bool emit_interpolate_instruction(GLSLstd450 opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	uint32_t input_element_index;
	if (!get_constant_operand(instruction, 1, &input_element_index))
		return false;

	const auto &meta = impl.input_elements_meta[input_element_index];
	uint32_t var_id = meta.id;
	uint32_t ptr_id;

	uint32_t num_rows = builder.getNumTypeComponents(builder.getDerefTypeId(var_id));

	if (num_rows > 1)
	{
		// Need to deal with signed vs unsigned here.
		Operation *op =
			impl.allocate(spv::OpAccessChain,
			              builder.makePointer(spv::StorageClassInput,
			                                  impl.get_effective_input_output_type_id(meta.component_type)));

		op->add_ids({ var_id, impl.get_id_for_value(instruction->getOperand(3), 32) });
		impl.add(op);
		ptr_id = op->id;
	}
	else
		ptr_id = var_id;

	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	spv::Id aux_id = 0;

	if (opcode == GLSLstd450InterpolateAtOffset)
	{
		spv::Id offsets[2] = {};
		bool is_non_const = false;
		for (unsigned i = 0; i < 2; i++)
		{
			auto *operand = instruction->getOperand(4 + i);
			auto *constant_operand = llvm::dyn_cast<llvm::ConstantInt>(operand);

			// Need to do it the tedious way, extracting bits and converting to float ...
			if (!constant_operand)
			{
				offsets[i] = impl.get_id_for_value(instruction->getOperand(4 + i));
				offsets[i] = build_attribute_offset(offsets[i], impl);
				is_non_const = true;
			}
			else
			{
				float off = float(constant_operand->getUniqueInteger().getSExtValue()) / 16.0f;
				offsets[i] = builder.makeFloatConstant(off);
			}
		}

		if (is_non_const)
			aux_id = impl.build_vector(builder.makeFloatType(32), offsets, 2);
		else
			aux_id = impl.build_constant_vector(builder.makeFloatType(32), offsets, 2);
	}
	else if (opcode == GLSLstd450InterpolateAtSample)
		aux_id = impl.get_id_for_value(instruction->getOperand(4));

	// Need to deal with signed vs unsigned here.
	Operation *op = impl.allocate(spv::OpExtInst, instruction,
	                              impl.get_effective_input_output_type_id(meta.component_type));
	op->add_id(impl.glsl_std450_ext);
	op->add_literal(opcode);
	op->add_id(ptr_id);

	if (aux_id)
		op->add_id(aux_id);

	impl.add(op);

	// Need to bitcast after we load.
	impl.fixup_load_type_io(meta.component_type, 1, instruction);
	builder.addCapability(spv::CapabilityInterpolationFunction);
	return true;
}